

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

size_t __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
::cancel(basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
         *this)

{
  service_type *this_00;
  implementation_type *impl;
  size_t sVar1;
  size_t s;
  error_code ec;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)&s);
  this_00 = detail::
            io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  impl = detail::
         io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
         ::get_implementation(&this->impl_);
  sVar1 = detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel(this_00,impl,(error_code *)&s);
  detail::throw_error((error_code *)&s,"cancel");
  return sVar1;
}

Assistant:

std::size_t cancel()
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().cancel(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
    return s;
  }